

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O0

void bashPrgEncrStep(void *buf,size_t count,void *state)

{
  octet *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  bash_prg_st *st;
  void *in_stack_ffffffffffffffd8;
  ulong local_10;
  void *local_8;
  
  if (in_RSI < (ulong)(*(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8))) {
    memXor2(in_RDX + *(long *)(in_RDX + 0xd8) + 0x10,in_RDI,in_RSI);
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x134227);
    *(ulong *)(in_RDX + 0xd8) = in_RSI + *(long *)(in_RDX + 0xd8);
  }
  else {
    memXor2(in_RDX + *(long *)(in_RDX + 0xd8) + 0x10,in_RDI,
            *(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8));
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x1342b2);
    local_8 = (void *)((long)in_RDI + (*(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8)));
    local_10 = in_RSI - (*(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8));
    bashF(in_RDX,in_stack_ffffffffffffffd8);
    while (*(ulong *)(in_RDX + 0xd0) <= local_10) {
      memXor2(in_RDX + 0x10,local_8,*(size_t *)(in_RDX + 0xd0));
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x13436d);
      local_8 = (void *)((long)local_8 + *(long *)(in_RDX + 0xd0));
      local_10 = local_10 - *(long *)(in_RDX + 0xd0);
      bashF(in_RDX,in_stack_ffffffffffffffd8);
    }
    *(ulong *)(in_RDX + 0xd8) = local_10;
    if (local_10 != 0) {
      memXor2(in_RDX + 0x10,local_8,local_10);
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x134402);
    }
  }
  return;
}

Assistant:

void bashPrgEncrStep(void* buf, size_t count, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), buf, count));
	// остатка буфера достаточно?
	if (count < st->buf_len - st->pos)
	{
		memXor2(st->s + st->pos, buf, count);
		memCopy(buf, st->s + st->pos, count);
		st->pos += count;
		return;
	}
	// новый буфер
	memXor2(st->s + st->pos, buf, st->buf_len - st->pos);
	memCopy(buf, st->s + st->pos, st->buf_len - st->pos);
	buf = (octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memXor2(st->s, buf, st->buf_len);
		memCopy(buf, st->s, st->buf_len);
		buf = (octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок
	if (st->pos = count)
	{
		memXor2(st->s, buf, count);
		memCopy(buf, st->s, count);
	}
}